

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

int __thiscall
curlpp::FormParts::Content::clone
          (Content *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  Content *unaff_retaddr;
  
  pvVar1 = operator_new(0x68);
  Content(unaff_retaddr,this);
  return (int)pvVar1;
}

Assistant:

curlpp::FormParts::Content *
curlpp::FormParts::Content::clone() const
{
   return new curlpp::FormParts::Content(*this);
}